

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

void __thiscall
Assimp::PLYImporter::LoadVertex
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  reference pPVar6;
  PropertyInstance *pPVar7;
  const_reference pvVar8;
  aiMesh *this_00;
  ulong uVar9;
  ulong uVar10;
  aiVector3D *paVar11;
  aiColor4D *paVar12;
  aiVector3t<float> *local_1e8;
  aiColor4t<float> *local_1c0;
  aiVector3t<float> *local_198;
  aiVector3t<float> *local_170;
  bool local_135;
  undefined1 auStack_134 [7];
  bool haveTextureCoords;
  aiVector3D tOut;
  bool local_101;
  undefined1 auStack_100 [7];
  bool haveColor;
  aiColor4D cOut;
  bool local_d5;
  undefined1 auStack_d4 [7];
  bool haveNormal;
  aiVector3D nOut;
  undefined1 local_ac [8];
  aiVector3D vOut;
  __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
  local_98;
  const_iterator a;
  uint cnt;
  uint _a;
  EDataType aiTexcoordTypes [2];
  uint aiTexcoord [2];
  EDataType aiColorsTypes [4];
  uint aiColors [4];
  EDataType local_50;
  EDataType aiNormalTypes [3];
  ai_uint aiNormal [3];
  EDataType aiTypes [3];
  ai_uint aiPositions [3];
  uint pos_local;
  ElementInstance *instElement_local;
  Element *pcElement_local;
  PLYImporter *this_local;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyLoader.cpp"
                  ,0x115,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyLoader.cpp"
                  ,0x116,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  aiTypes[1] = ~EDT_Char;
  aiTypes[2] = ~EDT_Char;
  aiPositions[0] = 0xffffffff;
  memset(aiNormal + 1,0,0xc);
  aiNormalTypes[1] = ~EDT_Char;
  aiNormalTypes[2] = ~EDT_Char;
  aiNormal[0] = 0xffffffff;
  memset(aiColors + 3,0,0xc);
  aiColorsTypes[2] = ~EDT_Char;
  aiColorsTypes[3] = ~EDT_Char;
  aiColors[0] = 0xffffffff;
  aiColors[1] = 0xffffffff;
  memset(aiTexcoord,0,0x10);
  aiTexcoordTypes[0] = ~EDT_Char;
  aiTexcoordTypes[1] = ~EDT_Char;
  memset(&cnt,0,8);
  a._M_current._4_4_ = EDT_Char;
  a._M_current._0_4_ = 0;
  local_98._M_current =
       (Property *)
       std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::begin
                 (&pcElement->alProperties);
  while( true ) {
    vOut._4_8_ = std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::end
                           (&pcElement->alProperties);
    bVar5 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                        *)&vOut.y);
    if (!bVar5) break;
    pPVar6 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
             ::operator*(&local_98);
    if ((pPVar6->bIsList & 1U) == 0) {
      pPVar6 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_98);
      if (pPVar6->Semantic == EST_XCoord) {
        a._M_current._0_4_ = (int)a._M_current + 1;
        aiTypes[1] = a._M_current._4_4_;
        pPVar6 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_98);
        aiNormal[1] = pPVar6->eType;
      }
      else {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_98);
        if (pPVar6->Semantic == EST_YCoord) {
          a._M_current._0_4_ = (int)a._M_current + 1;
          aiTypes[2] = a._M_current._4_4_;
          pPVar6 = __gnu_cxx::
                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                   ::operator*(&local_98);
          aiNormal[2] = pPVar6->eType;
        }
        else {
          pPVar6 = __gnu_cxx::
                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                   ::operator*(&local_98);
          if (pPVar6->Semantic == EST_ZCoord) {
            a._M_current._0_4_ = (int)a._M_current + 1;
            aiPositions[0] = a._M_current._4_4_;
            pPVar6 = __gnu_cxx::
                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                     ::operator*(&local_98);
            aiTypes[0] = pPVar6->eType;
          }
          else {
            pPVar6 = __gnu_cxx::
                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                     ::operator*(&local_98);
            if (pPVar6->Semantic == EST_XNormal) {
              a._M_current._0_4_ = (int)a._M_current + 1;
              aiNormalTypes[1] = a._M_current._4_4_;
              pPVar6 = __gnu_cxx::
                       __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                       ::operator*(&local_98);
              aiColors[3] = pPVar6->eType;
            }
            else {
              pPVar6 = __gnu_cxx::
                       __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                       ::operator*(&local_98);
              if (pPVar6->Semantic == EST_YNormal) {
                a._M_current._0_4_ = (int)a._M_current + 1;
                aiNormalTypes[2] = a._M_current._4_4_;
                pPVar6 = __gnu_cxx::
                         __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                         ::operator*(&local_98);
                local_50 = pPVar6->eType;
              }
              else {
                pPVar6 = __gnu_cxx::
                         __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                         ::operator*(&local_98);
                if (pPVar6->Semantic == EST_ZNormal) {
                  a._M_current._0_4_ = (int)a._M_current + 1;
                  aiNormal[0] = a._M_current._4_4_;
                  pPVar6 = __gnu_cxx::
                           __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                           ::operator*(&local_98);
                  aiNormalTypes[0] = pPVar6->eType;
                }
                else {
                  pPVar6 = __gnu_cxx::
                           __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                           ::operator*(&local_98);
                  if (pPVar6->Semantic == EST_Red) {
                    a._M_current._0_4_ = (int)a._M_current + 1;
                    aiColorsTypes[2] = a._M_current._4_4_;
                    pPVar6 = __gnu_cxx::
                             __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                             ::operator*(&local_98);
                    aiTexcoord[0] = pPVar6->eType;
                  }
                  else {
                    pPVar6 = __gnu_cxx::
                             __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                             ::operator*(&local_98);
                    if (pPVar6->Semantic == EST_Green) {
                      a._M_current._0_4_ = (int)a._M_current + 1;
                      aiColorsTypes[3] = a._M_current._4_4_;
                      pPVar6 = __gnu_cxx::
                               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                               ::operator*(&local_98);
                      aiTexcoord[1] = pPVar6->eType;
                    }
                    else {
                      pPVar6 = __gnu_cxx::
                               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                               ::operator*(&local_98);
                      if (pPVar6->Semantic == EST_Blue) {
                        a._M_current._0_4_ = (int)a._M_current + 1;
                        aiColors[0] = a._M_current._4_4_;
                        pPVar6 = __gnu_cxx::
                                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                 ::operator*(&local_98);
                        aiColorsTypes[0] = pPVar6->eType;
                      }
                      else {
                        pPVar6 = __gnu_cxx::
                                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                 ::operator*(&local_98);
                        if (pPVar6->Semantic == EST_Alpha) {
                          a._M_current._0_4_ = (int)a._M_current + 1;
                          aiColors[1] = a._M_current._4_4_;
                          pPVar6 = __gnu_cxx::
                                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                   ::operator*(&local_98);
                          aiColorsTypes[1] = pPVar6->eType;
                        }
                        else {
                          pPVar6 = __gnu_cxx::
                                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                   ::operator*(&local_98);
                          if (pPVar6->Semantic == EST_UTextureCoord) {
                            a._M_current._0_4_ = (int)a._M_current + 1;
                            aiTexcoordTypes[0] = a._M_current._4_4_;
                            pPVar6 = __gnu_cxx::
                                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                     ::operator*(&local_98);
                            cnt = pPVar6->eType;
                          }
                          else {
                            pPVar6 = __gnu_cxx::
                                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                     ::operator*(&local_98);
                            if (pPVar6->Semantic == EST_VTextureCoord) {
                              a._M_current._0_4_ = (int)a._M_current + 1;
                              aiTexcoordTypes[1] = a._M_current._4_4_;
                              pPVar6 = __gnu_cxx::
                                       __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                                       ::operator*(&local_98);
                              _a = pPVar6->eType;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
    ::operator++(&local_98);
    a._M_current._4_4_ = a._M_current._4_4_ + EDT_UChar;
  }
  if ((int)a._M_current != 0) {
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_ac);
    if (aiTypes[1] != ~EDT_Char) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiTypes[1]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      local_ac._0_4_ = PLY::PropertyInstance::ConvertTo<float>(*pvVar8,aiNormal[1]);
    }
    if (aiTypes[2] != ~EDT_Char) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiTypes[2]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      local_ac._4_4_ = PLY::PropertyInstance::ConvertTo<float>(*pvVar8,aiNormal[2]);
    }
    if (aiPositions[0] != 0xffffffff) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiPositions[0]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      nOut._4_8_ = *pvVar8;
      vOut.x = PLY::PropertyInstance::ConvertTo<float>((ValueUnion)nOut._4_8_,aiTypes[0]);
    }
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_d4);
    if (aiNormalTypes[1] != ~EDT_Char) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiNormalTypes[1]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      auStack_d4._0_4_ = PLY::PropertyInstance::ConvertTo<float>(*pvVar8,aiColors[3]);
    }
    if (aiNormalTypes[2] != ~EDT_Char) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiNormalTypes[2]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      register0x00001200 = PLY::PropertyInstance::ConvertTo<float>(*pvVar8,local_50);
    }
    local_d5 = aiNormalTypes[2] != ~EDT_Char || aiNormalTypes[1] != ~EDT_Char;
    if (aiNormal[0] != 0xffffffff) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiNormal[0]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      cOut._8_8_ = *pvVar8;
      nOut.x = PLY::PropertyInstance::ConvertTo<float>((ValueUnion)cOut._8_8_,aiNormalTypes[0]);
      local_d5 = true;
    }
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)auStack_100);
    if (aiColorsTypes[2] != ~EDT_Char) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiColorsTypes[2]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      auStack_100._0_4_ = NormalizeColorValue(*pvVar8,aiTexcoord[0]);
    }
    if (aiColorsTypes[3] != ~EDT_Char) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiColorsTypes[3]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      register0x00001200 = NormalizeColorValue(*pvVar8,aiTexcoord[1]);
    }
    local_101 = aiColorsTypes[3] != ~EDT_Char || aiColorsTypes[2] != ~EDT_Char;
    if (aiColors[0] != 0xffffffff) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiColors[0]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      cOut.r = NormalizeColorValue(*pvVar8,aiColorsTypes[0]);
      local_101 = true;
    }
    if (aiColors[1] == 0xffffffff) {
      cOut.g = 1.0;
    }
    else {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiColors[1]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      tOut._4_8_ = *pvVar8;
      cOut.g = NormalizeColorValue((ValueUnion)tOut._4_8_,aiColorsTypes[1]);
      local_101 = true;
    }
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_134);
    tOut.x = 0.0;
    bVar5 = aiTexcoordTypes[0] != ~EDT_Char;
    if (bVar5) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiTexcoordTypes[0]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      auStack_134._0_4_ = PLY::PropertyInstance::ConvertTo<float>(*pvVar8,cnt);
    }
    local_135 = aiTexcoordTypes[1] != ~EDT_Char;
    if (local_135) {
      pPVar7 = anon_unknown.dwarf_8eddaa::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,aiTexcoordTypes[1]);
      pvVar8 = std::
               vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
               ::front(&pPVar7->avList);
      register0x00001200 = PLY::PropertyInstance::ConvertTo<float>(*pvVar8,_a);
    }
    local_135 = local_135 || bVar5;
    if (this->mGeneratedMesh == (aiMesh *)0x0) {
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      this->mGeneratedMesh = this_00;
      this->mGeneratedMesh->mMaterialIndex = 0;
    }
    if (this->mGeneratedMesh->mVertices == (aiVector3D *)0x0) {
      this->mGeneratedMesh->mNumVertices = pcElement->NumOccur;
      uVar9 = CONCAT44(0,this->mGeneratedMesh->mNumVertices);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar9;
      uVar10 = SUB168(auVar1 * ZEXT816(0xc),0);
      if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      paVar11 = (aiVector3D *)operator_new__(uVar10);
      if (uVar9 != 0) {
        local_170 = paVar11;
        do {
          aiVector3t<float>::aiVector3t(local_170);
          local_170 = local_170 + 1;
        } while (local_170 != paVar11 + uVar9);
      }
      this->mGeneratedMesh->mVertices = paVar11;
    }
    paVar11 = this->mGeneratedMesh->mVertices + pos;
    paVar11->x = (float)local_ac._0_4_;
    paVar11->y = (float)local_ac._4_4_;
    paVar11->z = vOut.x;
    if (local_d5) {
      if (this->mGeneratedMesh->mNormals == (aiVector3D *)0x0) {
        uVar9 = CONCAT44(0,this->mGeneratedMesh->mNumVertices);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar9;
        uVar10 = SUB168(auVar2 * ZEXT816(0xc),0);
        if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        paVar11 = (aiVector3D *)operator_new__(uVar10);
        if (uVar9 != 0) {
          local_198 = paVar11;
          do {
            aiVector3t<float>::aiVector3t(local_198);
            local_198 = local_198 + 1;
          } while (local_198 != paVar11 + uVar9);
        }
        this->mGeneratedMesh->mNormals = paVar11;
      }
      paVar11 = this->mGeneratedMesh->mNormals + pos;
      paVar11->x = (float)auStack_d4._0_4_;
      paVar11->y = stack0xffffffffffffff30;
      paVar11->z = nOut.x;
    }
    if (local_101) {
      if (this->mGeneratedMesh->mColors[0] == (aiColor4D *)0x0) {
        uVar9 = CONCAT44(0,this->mGeneratedMesh->mNumVertices);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar9;
        uVar10 = SUB168(auVar3 * ZEXT816(0x10),0);
        if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        paVar12 = (aiColor4D *)operator_new__(uVar10);
        if (uVar9 != 0) {
          local_1c0 = paVar12;
          do {
            aiColor4t<float>::aiColor4t(local_1c0);
            local_1c0 = local_1c0 + 1;
          } while (local_1c0 != paVar12 + uVar9);
        }
        this->mGeneratedMesh->mColors[0] = paVar12;
      }
      paVar12 = this->mGeneratedMesh->mColors[0] + pos;
      paVar12->r = (float)auStack_100._0_4_;
      paVar12->g = stack0xffffffffffffff04;
      paVar12->b = cOut.r;
      paVar12->a = cOut.g;
    }
    if (local_135) {
      if (this->mGeneratedMesh->mTextureCoords[0] == (aiVector3D *)0x0) {
        this->mGeneratedMesh->mNumUVComponents[0] = 2;
        uVar9 = CONCAT44(0,this->mGeneratedMesh->mNumVertices);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar9;
        uVar10 = SUB168(auVar4 * ZEXT816(0xc),0);
        if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        paVar11 = (aiVector3D *)operator_new__(uVar10);
        if (uVar9 != 0) {
          local_1e8 = paVar11;
          do {
            aiVector3t<float>::aiVector3t(local_1e8);
            local_1e8 = local_1e8 + 1;
          } while (local_1e8 != paVar11 + uVar9);
        }
        this->mGeneratedMesh->mTextureCoords[0] = paVar11;
      }
      paVar11 = this->mGeneratedMesh->mTextureCoords[0] + pos;
      paVar11->x = (float)auStack_134._0_4_;
      paVar11->y = stack0xfffffffffffffed0;
      paVar11->z = tOut.x;
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadVertex(const PLY::Element* pcElement, const PLY::ElementInstance* instElement, unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    ai_uint aiPositions[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    ai_uint aiNormal[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiNormalTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiColors[4] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiColorsTypes[4] = { EDT_Char, EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiTexcoord[2] = { 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTexcoordTypes[2] = { EDT_Char, EDT_Char };

    // now check whether which normal components are available
    unsigned int _a( 0 ), cnt( 0 );
    for ( std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
            a != pcElement->alProperties.end(); ++a, ++_a) {
        if ((*a).bIsList) {
            continue;
        }

        // Positions
        if (PLY::EST_XCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[0] = _a;
            aiTypes[0] = (*a).eType;
        } else if (PLY::EST_YCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[1] = _a;
            aiTypes[1] = (*a).eType;
        } else if (PLY::EST_ZCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[2] = _a;
            aiTypes[2] = (*a).eType;
        } else if (PLY::EST_XNormal == (*a).Semantic) {
            // Normals
            ++cnt;
            aiNormal[0] = _a;
            aiNormalTypes[0] = (*a).eType;
        } else if (PLY::EST_YNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[1] = _a;
            aiNormalTypes[1] = (*a).eType;
        } else if (PLY::EST_ZNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[2] = _a;
            aiNormalTypes[2] = (*a).eType;
        } else if (PLY::EST_Red == (*a).Semantic) {
            // Colors
            ++cnt;
            aiColors[0] = _a;
            aiColorsTypes[0] = (*a).eType;
        } else if (PLY::EST_Green == (*a).Semantic) {
            ++cnt;
            aiColors[1] = _a;
            aiColorsTypes[1] = (*a).eType;
        } else if (PLY::EST_Blue == (*a).Semantic) {
            ++cnt;
            aiColors[2] = _a;
            aiColorsTypes[2] = (*a).eType;
        } else if (PLY::EST_Alpha == (*a).Semantic) {
            ++cnt;
            aiColors[3] = _a;
            aiColorsTypes[3] = (*a).eType;
        } else if (PLY::EST_UTextureCoord == (*a).Semantic) {
            // Texture coordinates
            ++cnt;
            aiTexcoord[0] = _a;
            aiTexcoordTypes[0] = (*a).eType;
        } else if (PLY::EST_VTextureCoord == (*a).Semantic) {
            ++cnt;
            aiTexcoord[1] = _a;
            aiTexcoordTypes[1] = (*a).eType;
        }
    }

    // check whether we have a valid source for the vertex data
    if (0 != cnt) {
        // Position
        aiVector3D vOut;
        if (0xFFFFFFFF != aiPositions[0]) {
            vOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[0]).avList.front(), aiTypes[0]);
        }

        if (0xFFFFFFFF != aiPositions[1]) {
            vOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[1]).avList.front(), aiTypes[1]);
        }

        if (0xFFFFFFFF != aiPositions[2]) {
            vOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[2]).avList.front(), aiTypes[2]);
        }

        // Normals
        aiVector3D nOut;
        bool haveNormal = false;
        if (0xFFFFFFFF != aiNormal[0]) {
            nOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[0]).avList.front(), aiNormalTypes[0]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[1]) {
            nOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[1]).avList.front(), aiNormalTypes[1]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[2]) {
            nOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[2]).avList.front(), aiNormalTypes[2]);
            haveNormal = true;
        }

        //Colors
        aiColor4D cOut;
        bool haveColor = false;
        if (0xFFFFFFFF != aiColors[0]) {
            cOut.r = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[0]).avList.front(), aiColorsTypes[0]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[1]) {
            cOut.g = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[1]).avList.front(), aiColorsTypes[1]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[2]) {
            cOut.b = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[2]).avList.front(), aiColorsTypes[2]);
            haveColor = true;
        }

        // assume 1.0 for the alpha channel if it is not set
        if (0xFFFFFFFF == aiColors[3]) {
            cOut.a = 1.0;
        } else {
            cOut.a = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[3]).avList.front(), aiColorsTypes[3]);

            haveColor = true;
        }

        //Texture coordinates
        aiVector3D tOut;
        tOut.z = 0;
        bool haveTextureCoords = false;
        if (0xFFFFFFFF != aiTexcoord[0]) {
            tOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[0]).avList.front(), aiTexcoordTypes[0]);
            haveTextureCoords = true;
        }

        if (0xFFFFFFFF != aiTexcoord[1]) {
            tOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[1]).avList.front(), aiTexcoordTypes[1]);
            haveTextureCoords = true;
        }

        //create aiMesh if needed
        if ( nullptr == mGeneratedMesh ) {
            mGeneratedMesh = new aiMesh();
            mGeneratedMesh->mMaterialIndex = 0;
        }

        if (nullptr == mGeneratedMesh->mVertices) {
            mGeneratedMesh->mNumVertices = pcElement->NumOccur;
            mGeneratedMesh->mVertices = new aiVector3D[mGeneratedMesh->mNumVertices];
        }

        mGeneratedMesh->mVertices[pos] = vOut;

        if (haveNormal) {
            if (nullptr == mGeneratedMesh->mNormals)
                mGeneratedMesh->mNormals = new aiVector3D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mNormals[pos] = nOut;
        }

        if (haveColor) {
            if (nullptr == mGeneratedMesh->mColors[0])
                mGeneratedMesh->mColors[0] = new aiColor4D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mColors[0][pos] = cOut;
        }

        if (haveTextureCoords) {
            if (nullptr == mGeneratedMesh->mTextureCoords[0]) {
                mGeneratedMesh->mNumUVComponents[0] = 2;
                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
            }
            mGeneratedMesh->mTextureCoords[0][pos] = tOut;
        }
    }
}